

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O0

void __thiscall
ProString::
ProString<QStringBuilder<QStringBuilder<char_const(&)[29],QString&>,char_const(&)[2]>,QLatin1String&>
          (ProString *this,
          QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[29],_QString_&>,_const_char_(&)[2]>,_QLatin1String_&>
          *str)

{
  long lVar1;
  ProString *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[29],_QString_&>,_const_char_(&)[2]>,_QLatin1String_&>
  *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ::QStringBuilder::operator_cast_to_QString(in_stack_ffffffffffffffb8);
  ProString(in_RDI,(QString *)in_stack_ffffffffffffffb8);
  QString::~QString((QString *)0x16e857);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ProString(const QStringBuilder<A, B> &str)
        : ProString(QString(str))
    {}